

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall testing::Action<void_(int)>::Perform(Action<void_(int)> *this,ArgumentTuple *args)

{
  bool bVar1;
  ArgumentTuple *args_local;
  Action<void_(int)> *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/build_O0/googletest-src/googlemock/include/gmock/gmock-actions.h"
               ,0x31b);
  }
  internal::Apply<std::function<void(int)>const&,std::tuple<int>>(&this->fun_,args);
  return;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }